

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::IntegerStateQueryTests::init
          (IntegerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  QueryType QVar1;
  Context *pCVar2;
  MaxSamplesCase *pMVar3;
  char *pcVar4;
  Context **ppCVar5;
  TexBindingCase *pTVar6;
  MinimumValueCase *pMVar7;
  TestCase *pTVar8;
  BufferBindingCase *pBVar9;
  FramebufferMinimumValueCase *pFVar10;
  LegacyVectorLimitCase *pLVar11;
  TextureGatherLimitCase *pTVar12;
  CombinedUniformComponentsCase *pCVar13;
  long lVar14;
  QueryType in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  TestNode *local_80;
  Context **local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppCVar5 = &(this->super_TestCaseGroup).m_context;
  local_80 = (TestNode *)this;
  local_78 = ppCVar5;
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar3 = (MaxSamplesCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_color_texture_samples_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MaxSamplesCase::MaxSamplesCase
              (pMVar3,pCVar2,local_70._M_dataplus._M_p,"Test GL_MAX_COLOR_TEXTURE_SAMPLES",0x910e,
               QVar1,in_stack_ffffffffffffff48);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar3);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar3 = (MaxSamplesCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_depth_texture_samples_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MaxSamplesCase::MaxSamplesCase
              (pMVar3,pCVar2,local_70._M_dataplus._M_p,"Test GL_MAX_DEPTH_TEXTURE_SAMPLES",0x910f,
               QVar1,in_stack_ffffffffffffff48);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar3);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar3 = (MaxSamplesCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_integer_samples_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MaxSamplesCase::MaxSamplesCase
              (pMVar3,pCVar2,local_70._M_dataplus._M_p,"Test GL_MAX_INTEGER_SAMPLES",0x9110,QVar1,
               in_stack_ffffffffffffff48);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar3);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pTVar6 = (TexBindingCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"texture_binding_2d_multisample_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::TexBindingCase::TexBindingCase
              (pTVar6,pCVar2,local_70._M_dataplus._M_p,"Test TEXTURE_BINDING_2D_MULTISAMPLE",0x9100,
               0x9104,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pTVar6);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pTVar6 = (TexBindingCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"texture_binding_2d_multisample_array_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::TexBindingCase::TexBindingCase
              (pTVar6,pCVar2,local_70._M_dataplus._M_p,"Test TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY",
               0x9102,0x9105,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pTVar6);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pTVar6 = (TexBindingCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"texture_binding_cube_map_array_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::TexBindingCase::TexBindingCase
              (pTVar6,pCVar2,local_70._M_dataplus._M_p,"Test TEXTURE_BINDING_CUBE_MAP_ARRAY",0x9009,
               0x900a,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pTVar6);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pTVar6 = (TexBindingCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"texture_binding_buffer_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::TexBindingCase::TexBindingCase
              (pTVar6,pCVar2,local_70._M_dataplus._M_p,"Test TEXTURE_BINDING_BUFFER",0x8c2a,0x8c2c,
               QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pTVar6);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_vertex_attrib_relative_offset_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_VERTEX_ATTRIB_RELATIVE_OFFSET",
               0x82d9,0x7ff,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_vertex_attrib_bindings_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_VERTEX_ATTRIB_BINDINGS",0x82da,0x10
               ,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_vertex_attrib_stride_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_VERTEX_ATTRIB_STRIDE",0x82e5,0x800,
               QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_sample_mask_words_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_SAMPLE_MASK_WORDS",0x8e59,1,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pTVar8 = (TestCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"shader_storage_buffer_offset_alignment_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    TestCase::TestCase(pTVar8,pCVar2,local_70._M_dataplus._M_p,
                       "Test SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT");
    (pTVar8->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a12f28;
    pTVar8[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x100000090df;
    *(QueryType *)&pTVar8[1].super_TestCase.super_TestNode.m_testCtx = QVar1;
    *(undefined4 *)((long)&pTVar8[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x13;
    tcu::TestNode::addChild(local_80,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pBVar9 = (BufferBindingCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"draw_indirect_buffer_binding_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::BufferBindingCase::BufferBindingCase
              (pBVar9,pCVar2,local_70._M_dataplus._M_p,"Test DRAW_INDIRECT_BUFFER_BINDING",0x8f43,
               0x8f3f,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pBVar9);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pBVar9 = (BufferBindingCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"atomic_counter_buffer_binding_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::BufferBindingCase::BufferBindingCase
              (pBVar9,pCVar2,local_70._M_dataplus._M_p,"Test ATOMIC_COUNTER_BUFFER_BINDING",0x92c1,
               0x92c0,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pBVar9);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pBVar9 = (BufferBindingCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"shader_storage_buffer_binding_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::BufferBindingCase::BufferBindingCase
              (pBVar9,pCVar2,local_70._M_dataplus._M_p,"Test SHADER_STORAGE_BUFFER_BINDING",0x90d3,
               0x90d2,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pBVar9);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pBVar9 = (BufferBindingCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"dispatch_indirect_buffer_binding_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::BufferBindingCase::BufferBindingCase
              (pBVar9,pCVar2,local_70._M_dataplus._M_p,"Test DISPATCH_INDIRECT_BUFFER_BINDING",
               0x90ef,0x90ee,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pBVar9);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pFVar10 = (FramebufferMinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_framebuffer_width_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::FramebufferMinimumValueCase::FramebufferMinimumValueCase
              (pFVar10,pCVar2,local_70._M_dataplus._M_p,"Test MAX_FRAMEBUFFER_WIDTH",0x9315,0x800,
               0xd33,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pFVar10);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pFVar10 = (FramebufferMinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_framebuffer_height_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::FramebufferMinimumValueCase::FramebufferMinimumValueCase
              (pFVar10,pCVar2,local_70._M_dataplus._M_p,"Test MAX_FRAMEBUFFER_HEIGHT",0x9316,0x800,
               0xd33,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pFVar10);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pFVar10 = (FramebufferMinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_framebuffer_samples_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::FramebufferMinimumValueCase::FramebufferMinimumValueCase
              (pFVar10,pCVar2,local_70._M_dataplus._M_p,"Test MAX_FRAMEBUFFER_SAMPLES",0x9318,4,
               0x8d57,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pFVar10);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pTVar8 = (TestCase *)operator_new(0x80);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"program_pipeline_binding_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    TestCase::TestCase(pTVar8,pCVar2,local_70._M_dataplus._M_p,"Test PROGRAM_PIPELINE_BINDING");
    (pTVar8->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a13018;
    *(QueryType *)&pTVar8[1].super_TestCase.super_TestNode._vptr_TestNode = QVar1;
    tcu::TestNode::addChild(local_80,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_vertex_atomic_counter_buffers_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_VERTEX_ATOMIC_COUNTER_BUFFERS",
               0x92cc,0,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_vertex_atomic_counters_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_VERTEX_ATOMIC_COUNTERS",0x92d2,0,
               QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_vertex_image_uniforms_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_VERTEX_IMAGE_UNIFORMS",0x90ca,0,
               QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_vertex_shader_storage_blocks_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_VERTEX_SHADER_STORAGE_BLOCKS",
               0x90d6,0,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_vertex_uniform_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_VERTEX_UNIFORM_COMPONENTS",0x8b4a,
               0x400,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_fragment_atomic_counter_buffers_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS",
               0x92d0,0,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_fragment_atomic_counters_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_FRAGMENT_ATOMIC_COUNTERS",0x92d6,0,
               QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_fragment_image_uniforms_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_FRAGMENT_IMAGE_UNIFORMS",0x90ce,0,
               QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_fragment_shader_storage_blocks_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_FRAGMENT_SHADER_STORAGE_BLOCKS",
               0x90da,0,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_fragment_uniform_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_FRAGMENT_UNIFORM_COMPONENTS",0x8b49
               ,0x400,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_compute_work_group_invocations_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_COMPUTE_WORK_GROUP_INVOCATIONS",
               0x90eb,0x80,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_compute_uniform_blocks_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_COMPUTE_UNIFORM_BLOCKS",0x91bb,0xc,
               QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_compute_texture_image_units_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_COMPUTE_TEXTURE_IMAGE_UNITS",0x91bc
               ,0x10,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_compute_shared_memory_size_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_COMPUTE_SHARED_MEMORY_SIZE",0x8262,
               0x4000,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_compute_uniform_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_COMPUTE_UNIFORM_COMPONENTS",0x8263,
               0x400,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_compute_atomic_counter_buffers_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_COMPUTE_ATOMIC_COUNTER_BUFFERS",
               0x8264,1,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_compute_atomic_counters_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_COMPUTE_ATOMIC_COUNTERS",0x8265,8,
               QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_compute_image_uniforms_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_COMPUTE_IMAGE_UNIFORMS",0x91bd,4,
               QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_compute_shader_storage_blocks_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_COMPUTE_SHADER_STORAGE_BLOCKS",
               0x90db,4,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_uniform_locations_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_UNIFORM_LOCATIONS",0x826e,0x400,
               QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_atomic_counter_buffer_bindings_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_ATOMIC_COUNTER_BUFFER_BINDINGS",
               0x92dc,1,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_atomic_counter_buffer_size_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_ATOMIC_COUNTER_BUFFER_SIZE",0x92d8,
               0x20,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_combined_atomic_counter_buffers_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_COMBINED_ATOMIC_COUNTER_BUFFERS",
               0x92d1,1,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_combined_atomic_counters_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_COMBINED_ATOMIC_COUNTERS",0x92d7,8,
               QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_image_units_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_IMAGE_UNITS",0x8f38,4,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_combined_image_uniforms_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_COMBINED_IMAGE_UNIFORMS",0x90cf,4,
               QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_shader_storage_buffer_bindings_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_SHADER_STORAGE_BUFFER_BINDINGS",
               0x90dd,4,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_shader_storage_block_size_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_SHADER_STORAGE_BLOCK_SIZE",0x90de,
               0x8000000,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_combined_shader_storage_blocks_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_COMBINED_SHADER_STORAGE_BLOCKS",
               0x90dc,4,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_combined_shader_output_resources_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_COMBINED_SHADER_OUTPUT_RESOURCES",
               0x8f39,4,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pTVar8 = (TestCase *)operator_new(0x80);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_uniform_buffer_bindings_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    TestCase::TestCase(pTVar8,pCVar2,local_70._M_dataplus._M_p,"Test MAX_UNIFORM_BUFFER_BINDINGS");
    (pTVar8->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a13068;
    *(QueryType *)&pTVar8[1].super_TestCase.super_TestNode._vptr_TestNode = QVar1;
    tcu::TestNode::addChild(local_80,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pTVar8 = (TestCase *)operator_new(0x80);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_combined_uniform_blocks_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    TestCase::TestCase(pTVar8,pCVar2,local_70._M_dataplus._M_p,"Test MAX_COMBINED_UNIFORM_BLOCKS");
    (pTVar8->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a130b8;
    *(QueryType *)&pTVar8[1].super_TestCase.super_TestNode._vptr_TestNode = QVar1;
    tcu::TestNode::addChild(local_80,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pTVar8 = (TestCase *)operator_new(0x80);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_combined_texture_image_units_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    TestCase::TestCase(pTVar8,pCVar2,local_70._M_dataplus._M_p,
                       "Test MAX_COMBINED_TEXTURE_IMAGE_UNITS");
    (pTVar8->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a13108;
    *(QueryType *)&pTVar8[1].super_TestCase.super_TestNode._vptr_TestNode = QVar1;
    tcu::TestNode::addChild(local_80,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pTVar8 = (TestCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_combined_compute_uniform_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    TestCase::TestCase(pTVar8,pCVar2,local_70._M_dataplus._M_p,
                       "Test MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS");
    (pTVar8->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a13158;
    *(undefined4 *)&pTVar8[1].super_TestCase.super_TestNode._vptr_TestNode = 0x8266;
    *(QueryType *)((long)&pTVar8[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = QVar1;
    *(undefined4 *)&pTVar8[1].super_TestCase.super_TestNode.m_testCtx = 0x13;
    tcu::TestNode::addChild(local_80,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pLVar11 = (LegacyVectorLimitCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_vertex_uniform_vectors_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::LegacyVectorLimitCase::LegacyVectorLimitCase
              (pLVar11,pCVar2,local_70._M_dataplus._M_p,"Test MAX_VERTEX_UNIFORM_VECTORS",0x8dfb,
               0x8b4a,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pLVar11);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pLVar11 = (LegacyVectorLimitCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_fragment_uniform_vectors_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::LegacyVectorLimitCase::LegacyVectorLimitCase
              (pLVar11,pCVar2,local_70._M_dataplus._M_p,"Test MAX_FRAGMENT_UNIFORM_VECTORS",0x8dfd,
               0x8b49,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pLVar11);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pTVar12 = (TextureGatherLimitCase *)operator_new(0x80);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"min_program_texture_gather_offset_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::TextureGatherLimitCase::TextureGatherLimitCase
              (pTVar12,pCVar2,local_70._M_dataplus._M_p,"Test MIN_PROGRAM_TEXTURE_GATHER_OFFSET",
               false,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pTVar12);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pTVar12 = (TextureGatherLimitCase *)operator_new(0x80);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_program_texture_gather_offset_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::TextureGatherLimitCase::TextureGatherLimitCase
              (pTVar12,pCVar2,local_70._M_dataplus._M_p,"Test MAX_PROGRAM_TEXTURE_GATHER_OFFSET",
               true,QVar1);
    tcu::TestNode::addChild(local_80,(TestNode *)pTVar12);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_framebuffer_layers_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_FRAMEBUFFER_LAYERS",0x9317,0x100,
               QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"fragment_interpolation_offset_bits_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test FRAGMENT_INTERPOLATION_OFFSET_BITS",
               0x8e5d,4,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_texture_buffer_size_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TEXTURE_BUFFER_SIZE",0x8c2b,0x10000
               ,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pTVar8 = (TestCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"texture_buffer_offset_alignment_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    TestCase::TestCase(pTVar8,pCVar2,local_70._M_dataplus._M_p,
                       "Test TEXTURE_BUFFER_OFFSET_ALIGNMENT");
    (pTVar8->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a12f28;
    pTVar8[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x1000000919f;
    *(QueryType *)&pTVar8[1].super_TestCase.super_TestNode.m_testCtx = QVar1;
    *(undefined4 *)((long)&pTVar8[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x23;
    tcu::TestNode::addChild(local_80,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_gen_level_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TESS_GEN_LEVEL",0x8e7e,0x40,QVar1,
               (ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_patch_vertices_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_PATCH_VERTICES",0x8e7d,0x20,QVar1,
               (ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_patch_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TESS_PATCH_COMPONENTS",0x8e84,0x78,
               QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_control_uniform_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TESS_CONTROL_UNIFORM_COMPONENTS",
               0x8e7f,0x400,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_control_texture_image_units_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS",
               0x8e81,0x10,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_control_output_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TESS_CONTROL_OUTPUT_COMPONENTS",
               0x8e83,0x40,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_control_total_output_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,
               "Test MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS",0x8e85,0x800,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_control_input_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TESS_CONTROL_INPUT_COMPONENTS",
               0x886c,0x40,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_control_uniform_blocks_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TESS_CONTROL_UNIFORM_BLOCKS",0x8e89
               ,0xc,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_control_atomic_counter_buffers_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,
               "Test MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS",0x92cd,0,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_control_atomic_counters_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TESS_CONTROL_ATOMIC_COUNTERS",
               0x92d3,0,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_control_shader_storage_blocks_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS"
               ,0x90d8,0,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_evaluation_uniform_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TESS_EVALUATION_UNIFORM_COMPONENTS"
               ,0x8e80,0x400,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_evaluation_texture_image_units_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,
               "Test MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS",0x8e82,0x10,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_evaluation_output_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TESS_EVALUATION_OUTPUT_COMPONENTS",
               0x8e86,0x40,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_evaluation_input_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TESS_EVALUATION_INPUT_COMPONENTS",
               0x886d,0x40,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_evaluation_uniform_blocks_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TESS_EVALUATION_UNIFORM_BLOCKS",
               0x8e8a,0xc,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_evaluation_atomic_counter_buffers_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,
               "Test MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS",0x92ce,0,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_evaluation_atomic_counters_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TESS_EVALUATION_ATOMIC_COUNTERS",
               0x92d4,0,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_evaluation_shader_storage_blocks_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,
               "Test MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS",0x90d9,0,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_geometry_uniform_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_GEOMETRY_UNIFORM_COMPONENTS",0x8ddf
               ,0x400,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_geometry_uniform_blocks_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_GEOMETRY_UNIFORM_BLOCKS",0x8a2c,0xc
               ,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_geometry_input_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_GEOMETRY_INPUT_COMPONENTS",0x9123,
               0x40,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_geometry_output_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_GEOMETRY_OUTPUT_COMPONENTS",0x9124,
               0x40,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_geometry_output_vertices_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_GEOMETRY_OUTPUT_VERTICES",0x8de0,
               0x100,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_geometry_total_output_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS",
               0x8de1,0x400,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_geometry_texture_image_units_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_GEOMETRY_TEXTURE_IMAGE_UNITS",
               0x8c29,0x10,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_geometry_shader_invocations_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_GEOMETRY_SHADER_INVOCATIONS",0x8e5a
               ,0x20,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_geometry_atomic_counter_buffers_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS",
               0x92cf,0,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_geometry_atomic_counters_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_GEOMETRY_ATOMIC_COUNTERS",0x92d5,0,
               QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_geometry_shader_storage_blocks_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_GEOMETRY_SHADER_STORAGE_BLOCKS",
               0x90d7,0,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_control_image_uniforms_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TESS_CONTROL_IMAGE_UNIFORMS",0x90cb
               ,0,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_tess_evaluation_image_uniforms_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_TESS_EVALUATION_IMAGE_UNIFORMS",
               0x90cc,0,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_geometry_image_uniforms_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_GEOMETRY_IMAGE_UNIFORMS",0x90cd,0,
               QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"debug_logged_messages_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test DEBUG_LOGGED_MESSAGES",0x9145,0,QVar1,
               (ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"debug_next_logged_message_length_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH",
               0x8243,0,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"debug_group_stack_depth_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test DEBUG_GROUP_STACK_DEPTH",0x826d,0,QVar1
               ,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_debug_message_length_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_DEBUG_MESSAGE_LENGTH",0x9143,1,
               QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_debug_logged_messages_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_DEBUG_LOGGED_MESSAGES",0x9144,1,
               QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_debug_group_stack_depth_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_DEBUG_GROUP_STACK_DEPTH",0x826c,
               0x40,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_label_length_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test MAX_LABEL_LENGTH",0x82e8,0x100,QVar1,
               (ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pMVar7 = (MinimumValueCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"texture_buffer_binding_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::MinimumValueCase::MinimumValueCase
              (pMVar7,pCVar2,local_70._M_dataplus._M_p,"Test TEXTURE_BUFFER_BINDING",0x8c2a,0,QVar1,
               (ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pCVar13 = (CombinedUniformComponentsCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_combined_tess_control_uniform_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::CombinedUniformComponentsCase::CombinedUniformComponentsCase
              (pCVar13,pCVar2,local_70._M_dataplus._M_p,
               "Test MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS",0x8e1e,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pCVar13);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pCVar13 = (CombinedUniformComponentsCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_combined_tess_evaluation_uniform_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::CombinedUniformComponentsCase::CombinedUniformComponentsCase
              (pCVar13,pCVar2,local_70._M_dataplus._M_p,
               "Test MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS",0x8e1f,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pCVar13);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
    QVar1 = *(QueryType *)((long)&DAT_00823770 + lVar14);
    pCVar13 = (CombinedUniformComponentsCase *)operator_new(0x88);
    pCVar2 = *local_78;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,&local_a0,"max_combined_geometry_uniform_components_");
    pcVar4 = anon_unknown_0::getVerifierSuffix(QVar1);
    std::operator+(&local_70,&local_50,pcVar4);
    anon_unknown_0::CombinedUniformComponentsCase::CombinedUniformComponentsCase
              (pCVar13,pCVar2,local_70._M_dataplus._M_p,
               "Test MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS",0x8a32,QVar1,(ApiType)0x23);
    tcu::TestNode::addChild(local_80,(TestNode *)pCVar13);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar5 = (Context **)std::__cxx11::string::~string((string *)&local_a0);
  }
  return (int)ppCVar5;
}

Assistant:

void IntegerStateQueryTests::init (void)
{
	// Verifiers
	const QueryType verifiers[]	= { QUERY_BOOLEAN, QUERY_INTEGER, QUERY_INTEGER64, QUERY_FLOAT };

#define FOR_EACH_VERIFIER(X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)	\
	{																						\
		const char* verifierSuffix = getVerifierSuffix(verifiers[verifierNdx]);				\
		const QueryType verifier = verifiers[verifierNdx];									\
		this->addChild(X);																	\
	}

	FOR_EACH_VERIFIER(new MaxSamplesCase(m_context,		(std::string() + "max_color_texture_samples_" + verifierSuffix).c_str(),				"Test GL_MAX_COLOR_TEXTURE_SAMPLES",			GL_MAX_COLOR_TEXTURE_SAMPLES,		1,	verifier))
	FOR_EACH_VERIFIER(new MaxSamplesCase(m_context,		(std::string() + "max_depth_texture_samples_" + verifierSuffix).c_str(),				"Test GL_MAX_DEPTH_TEXTURE_SAMPLES",			GL_MAX_DEPTH_TEXTURE_SAMPLES,		1,	verifier))
	FOR_EACH_VERIFIER(new MaxSamplesCase(m_context,		(std::string() + "max_integer_samples_" + verifierSuffix).c_str(),						"Test GL_MAX_INTEGER_SAMPLES",					GL_MAX_INTEGER_SAMPLES,				1,	verifier))

	FOR_EACH_VERIFIER(new TexBindingCase(m_context,		(std::string() + "texture_binding_2d_multisample_" + verifierSuffix).c_str(),			"Test TEXTURE_BINDING_2D_MULTISAMPLE",			GL_TEXTURE_2D_MULTISAMPLE,			GL_TEXTURE_BINDING_2D_MULTISAMPLE,			verifier))
	FOR_EACH_VERIFIER(new TexBindingCase(m_context,		(std::string() + "texture_binding_2d_multisample_array_" + verifierSuffix).c_str(),		"Test TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY",	GL_TEXTURE_2D_MULTISAMPLE_ARRAY,	GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY,	verifier))
	FOR_EACH_VERIFIER(new TexBindingCase(m_context,		(std::string() + "texture_binding_cube_map_array_" + verifierSuffix).c_str(),			"Test TEXTURE_BINDING_CUBE_MAP_ARRAY",			GL_TEXTURE_CUBE_MAP_ARRAY,			GL_TEXTURE_BINDING_CUBE_MAP_ARRAY,			verifier))
	FOR_EACH_VERIFIER(new TexBindingCase(m_context,		(std::string() + "texture_binding_buffer_" + verifierSuffix).c_str(),					"Test TEXTURE_BINDING_BUFFER",					GL_TEXTURE_BUFFER,					GL_TEXTURE_BINDING_BUFFER,					verifier))

	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_vertex_attrib_relative_offset_" + verifierSuffix).c_str(),		"Test MAX_VERTEX_ATTRIB_RELATIVE_OFFSET",		GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET,	2047,	verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_vertex_attrib_bindings_" + verifierSuffix).c_str(),				"Test MAX_VERTEX_ATTRIB_BINDINGS",				GL_MAX_VERTEX_ATTRIB_BINDINGS,			16,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_vertex_attrib_stride_" + verifierSuffix).c_str(),					"Test MAX_VERTEX_ATTRIB_STRIDE",				GL_MAX_VERTEX_ATTRIB_STRIDE,			2048,	verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_sample_mask_words_" + verifierSuffix).c_str(),					"Test MAX_SAMPLE_MASK_WORDS",					GL_MAX_SAMPLE_MASK_WORDS,				1,		verifier))

	FOR_EACH_VERIFIER(new AlignmentCase(m_context,		(std::string() + "shader_storage_buffer_offset_alignment_" + verifierSuffix).c_str(),	"Test SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT",	GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT,	256,	verifier))

	FOR_EACH_VERIFIER(new BufferBindingCase(m_context,	(std::string() + "draw_indirect_buffer_binding_" + verifierSuffix).c_str(),				"Test DRAW_INDIRECT_BUFFER_BINDING",			GL_DRAW_INDIRECT_BUFFER_BINDING,		GL_DRAW_INDIRECT_BUFFER,		verifier))
	FOR_EACH_VERIFIER(new BufferBindingCase(m_context,	(std::string() + "atomic_counter_buffer_binding_" + verifierSuffix).c_str(),			"Test ATOMIC_COUNTER_BUFFER_BINDING",			GL_ATOMIC_COUNTER_BUFFER_BINDING,		GL_ATOMIC_COUNTER_BUFFER,		verifier))
	FOR_EACH_VERIFIER(new BufferBindingCase(m_context,	(std::string() + "shader_storage_buffer_binding_" + verifierSuffix).c_str(),			"Test SHADER_STORAGE_BUFFER_BINDING",			GL_SHADER_STORAGE_BUFFER_BINDING,		GL_SHADER_STORAGE_BUFFER,		verifier))
	FOR_EACH_VERIFIER(new BufferBindingCase(m_context,	(std::string() + "dispatch_indirect_buffer_binding_" + verifierSuffix).c_str(),			"Test DISPATCH_INDIRECT_BUFFER_BINDING",		GL_DISPATCH_INDIRECT_BUFFER_BINDING,	GL_DISPATCH_INDIRECT_BUFFER,	verifier))

	FOR_EACH_VERIFIER(new FramebufferMinimumValueCase(m_context,	(std::string() + "max_framebuffer_width_" + verifierSuffix).c_str(),		"Test MAX_FRAMEBUFFER_WIDTH",					GL_MAX_FRAMEBUFFER_WIDTH,				2048,	GL_MAX_TEXTURE_SIZE,	verifier))
	FOR_EACH_VERIFIER(new FramebufferMinimumValueCase(m_context,	(std::string() + "max_framebuffer_height_" + verifierSuffix).c_str(),		"Test MAX_FRAMEBUFFER_HEIGHT",					GL_MAX_FRAMEBUFFER_HEIGHT,				2048,	GL_MAX_TEXTURE_SIZE,	verifier))
	FOR_EACH_VERIFIER(new FramebufferMinimumValueCase(m_context,	(std::string() + "max_framebuffer_samples_" + verifierSuffix).c_str(),		"Test MAX_FRAMEBUFFER_SAMPLES",					GL_MAX_FRAMEBUFFER_SAMPLES,				4,		GL_MAX_SAMPLES,			verifier))

	FOR_EACH_VERIFIER(new ProgramPipelineBindingCase(m_context,	(std::string() + "program_pipeline_binding_" + verifierSuffix).c_str(),			"Test PROGRAM_PIPELINE_BINDING",	verifier))

	// vertex
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_vertex_atomic_counter_buffers_" + verifierSuffix).c_str(),		"Test MAX_VERTEX_ATOMIC_COUNTER_BUFFERS",		GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS,	0,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_vertex_atomic_counters_" + verifierSuffix).c_str(),				"Test MAX_VERTEX_ATOMIC_COUNTERS",				GL_MAX_VERTEX_ATOMIC_COUNTERS,			0,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_vertex_image_uniforms_" + verifierSuffix).c_str(),				"Test MAX_VERTEX_IMAGE_UNIFORMS",				GL_MAX_VERTEX_IMAGE_UNIFORMS,			0,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_vertex_shader_storage_blocks_" + verifierSuffix).c_str(),			"Test MAX_VERTEX_SHADER_STORAGE_BLOCKS",		GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS,	0,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_vertex_uniform_components_" + verifierSuffix).c_str(),			"Test MAX_VERTEX_UNIFORM_COMPONENTS",			GL_MAX_VERTEX_UNIFORM_COMPONENTS,		1024,	verifier))

	// fragment
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_fragment_atomic_counter_buffers_" + verifierSuffix).c_str(),		"Test MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS",		GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS,	0,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_fragment_atomic_counters_" + verifierSuffix).c_str(),				"Test MAX_FRAGMENT_ATOMIC_COUNTERS",			GL_MAX_FRAGMENT_ATOMIC_COUNTERS,		0,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_fragment_image_uniforms_" + verifierSuffix).c_str(),				"Test MAX_FRAGMENT_IMAGE_UNIFORMS",				GL_MAX_FRAGMENT_IMAGE_UNIFORMS,			0,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_fragment_shader_storage_blocks_" + verifierSuffix).c_str(),		"Test MAX_FRAGMENT_SHADER_STORAGE_BLOCKS",		GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS,	0,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_fragment_uniform_components_" + verifierSuffix).c_str(),			"Test MAX_FRAGMENT_UNIFORM_COMPONENTS",			GL_MAX_FRAGMENT_UNIFORM_COMPONENTS,		1024,	verifier))

	// compute
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_work_group_invocations_" + verifierSuffix).c_str(),		"Test MAX_COMPUTE_WORK_GROUP_INVOCATIONS",		GL_MAX_COMPUTE_WORK_GROUP_INVOCATIONS,		128,	verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_uniform_blocks_" + verifierSuffix).c_str(),				"Test MAX_COMPUTE_UNIFORM_BLOCKS",				GL_MAX_COMPUTE_UNIFORM_BLOCKS,				12,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_texture_image_units_" + verifierSuffix).c_str(),			"Test MAX_COMPUTE_TEXTURE_IMAGE_UNITS",			GL_MAX_COMPUTE_TEXTURE_IMAGE_UNITS,			16,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_shared_memory_size_" + verifierSuffix).c_str(),			"Test MAX_COMPUTE_SHARED_MEMORY_SIZE",			GL_MAX_COMPUTE_SHARED_MEMORY_SIZE,			16384,	verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_uniform_components_" + verifierSuffix).c_str(),			"Test MAX_COMPUTE_UNIFORM_COMPONENTS",			GL_MAX_COMPUTE_UNIFORM_COMPONENTS,			1024,	verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_atomic_counter_buffers_" + verifierSuffix).c_str(),		"Test MAX_COMPUTE_ATOMIC_COUNTER_BUFFERS",		GL_MAX_COMPUTE_ATOMIC_COUNTER_BUFFERS,		1,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_atomic_counters_" + verifierSuffix).c_str(),				"Test MAX_COMPUTE_ATOMIC_COUNTERS",				GL_MAX_COMPUTE_ATOMIC_COUNTERS,				8,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_image_uniforms_" + verifierSuffix).c_str(),				"Test MAX_COMPUTE_IMAGE_UNIFORMS",				GL_MAX_COMPUTE_IMAGE_UNIFORMS,				4,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_compute_shader_storage_blocks_" + verifierSuffix).c_str(),		"Test MAX_COMPUTE_SHADER_STORAGE_BLOCKS",		GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS,		4,		verifier))

	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_uniform_locations_" + verifierSuffix).c_str(),					"Test MAX_UNIFORM_LOCATIONS",					GL_MAX_UNIFORM_LOCATIONS,					1024,	verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_atomic_counter_buffer_bindings_" + verifierSuffix).c_str(),		"Test MAX_ATOMIC_COUNTER_BUFFER_BINDINGS",		GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS,		1,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_atomic_counter_buffer_size_" + verifierSuffix).c_str(),			"Test MAX_ATOMIC_COUNTER_BUFFER_SIZE",			GL_MAX_ATOMIC_COUNTER_BUFFER_SIZE,			32,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_combined_atomic_counter_buffers_" + verifierSuffix).c_str(),		"Test MAX_COMBINED_ATOMIC_COUNTER_BUFFERS",		GL_MAX_COMBINED_ATOMIC_COUNTER_BUFFERS,		1,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_combined_atomic_counters_" + verifierSuffix).c_str(),				"Test MAX_COMBINED_ATOMIC_COUNTERS",			GL_MAX_COMBINED_ATOMIC_COUNTERS,			8,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_image_units_" + verifierSuffix).c_str(),							"Test MAX_IMAGE_UNITS",							GL_MAX_IMAGE_UNITS,							4,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_combined_image_uniforms_" + verifierSuffix).c_str(),				"Test MAX_COMBINED_IMAGE_UNIFORMS",				GL_MAX_COMBINED_IMAGE_UNIFORMS,				4,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_shader_storage_buffer_bindings_" + verifierSuffix).c_str(),		"Test MAX_SHADER_STORAGE_BUFFER_BINDINGS",		GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS,		4,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_shader_storage_block_size_" + verifierSuffix).c_str(),			"Test MAX_SHADER_STORAGE_BLOCK_SIZE",			GL_MAX_SHADER_STORAGE_BLOCK_SIZE,			1<<27,	verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_combined_shader_storage_blocks_" + verifierSuffix).c_str(),		"Test MAX_COMBINED_SHADER_STORAGE_BLOCKS",		GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS,		4,		verifier))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_combined_shader_output_resources_" + verifierSuffix).c_str(),		"Test MAX_COMBINED_SHADER_OUTPUT_RESOURCES",	GL_MAX_COMBINED_SHADER_OUTPUT_RESOURCES,	4,		verifier))

	FOR_EACH_VERIFIER(new MaxUniformBufferBindingsCase	(m_context,	(std::string() + "max_uniform_buffer_bindings_" + verifierSuffix).c_str(),				"Test MAX_UNIFORM_BUFFER_BINDINGS",				verifier))
	FOR_EACH_VERIFIER(new MaxCombinedUniformBlocksCase	(m_context,	(std::string() + "max_combined_uniform_blocks_" + verifierSuffix).c_str(),				"Test MAX_COMBINED_UNIFORM_BLOCKS",				verifier))
	FOR_EACH_VERIFIER(new MaxCombinedTexImageUnitsCase	(m_context,	(std::string() + "max_combined_texture_image_units_" + verifierSuffix).c_str(),			"Test MAX_COMBINED_TEXTURE_IMAGE_UNITS",		verifier))
	FOR_EACH_VERIFIER(new CombinedUniformComponentsCase	(m_context,	(std::string() + "max_combined_compute_uniform_components_" + verifierSuffix).c_str(),	"Test MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS, verifier))

	FOR_EACH_VERIFIER(new LegacyVectorLimitCase(m_context,	(std::string() + "max_vertex_uniform_vectors_" + verifierSuffix).c_str(),			"Test MAX_VERTEX_UNIFORM_VECTORS",				GL_MAX_VERTEX_UNIFORM_VECTORS,			GL_MAX_VERTEX_UNIFORM_COMPONENTS,	verifier))
	FOR_EACH_VERIFIER(new LegacyVectorLimitCase(m_context,	(std::string() + "max_fragment_uniform_vectors_" + verifierSuffix).c_str(),			"Test MAX_FRAGMENT_UNIFORM_VECTORS",			GL_MAX_FRAGMENT_UNIFORM_VECTORS,		GL_MAX_FRAGMENT_UNIFORM_COMPONENTS,	verifier))

	FOR_EACH_VERIFIER(new TextureGatherLimitCase(m_context,	(std::string() + "min_program_texture_gather_offset_" + verifierSuffix).c_str(),	"Test MIN_PROGRAM_TEXTURE_GATHER_OFFSET",		false,		verifier))
	FOR_EACH_VERIFIER(new TextureGatherLimitCase(m_context,	(std::string() + "max_program_texture_gather_offset_" + verifierSuffix).c_str(),	"Test MAX_PROGRAM_TEXTURE_GATHER_OFFSET",		true,		verifier))

	// GL ES 3.2 tests
	FOR_EACH_VERIFIER(new MinimumValueCase	(m_context,	(std::string() + "max_framebuffer_layers_" + verifierSuffix).c_str(),						"Test MAX_FRAMEBUFFER_LAYERS",						GL_MAX_FRAMEBUFFER_LAYERS,						256,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase	(m_context,	(std::string() + "fragment_interpolation_offset_bits_" + verifierSuffix).c_str(),			"Test FRAGMENT_INTERPOLATION_OFFSET_BITS",			GL_FRAGMENT_INTERPOLATION_OFFSET_BITS,			4,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase	(m_context,	(std::string() + "max_texture_buffer_size_" + verifierSuffix).c_str(),						"Test MAX_TEXTURE_BUFFER_SIZE",						GL_MAX_TEXTURE_BUFFER_SIZE,						65536,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new AlignmentCase		(m_context,	(std::string() + "texture_buffer_offset_alignment_" + verifierSuffix).c_str(),				"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",				GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,				256,	verifier,	glu::ApiType::es(3, 2)))

	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_gen_level_" + verifierSuffix).c_str(),							"Test MAX_TESS_GEN_LEVEL",							GL_MAX_TESS_GEN_LEVEL,							64,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_patch_vertices_" + verifierSuffix).c_str(),							"Test MAX_PATCH_VERTICES",							GL_MAX_PATCH_VERTICES,							32,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_patch_components_" + verifierSuffix).c_str(),					"Test MAX_TESS_PATCH_COMPONENTS",					GL_MAX_TESS_PATCH_COMPONENTS,					120,	verifier,	glu::ApiType::es(3, 2)))

	// tess control
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_uniform_components_" + verifierSuffix).c_str(),			"Test MAX_TESS_CONTROL_UNIFORM_COMPONENTS",			GL_MAX_TESS_CONTROL_UNIFORM_COMPONENTS,			1024,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_texture_image_units_" + verifierSuffix).c_str(),			"Test MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS",		GL_MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS,		16,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_output_components_" + verifierSuffix).c_str(),			"Test MAX_TESS_CONTROL_OUTPUT_COMPONENTS",			GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS,			64,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_total_output_components_" + verifierSuffix).c_str(),		"Test MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS",	GL_MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS,	2048,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_input_components_" + verifierSuffix).c_str(),			"Test MAX_TESS_CONTROL_INPUT_COMPONENTS",			GL_MAX_TESS_CONTROL_INPUT_COMPONENTS,			64,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_uniform_blocks_" + verifierSuffix).c_str(),				"Test MAX_TESS_CONTROL_UNIFORM_BLOCKS",				GL_MAX_TESS_CONTROL_UNIFORM_BLOCKS,				12,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_atomic_counter_buffers_" + verifierSuffix).c_str(),		"Test MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS",		GL_MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS,		0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_atomic_counters_" + verifierSuffix).c_str(),				"Test MAX_TESS_CONTROL_ATOMIC_COUNTERS",			GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS,			0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_shader_storage_blocks_" + verifierSuffix).c_str(),		"Test MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS",		GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS,		0,		verifier,	glu::ApiType::es(3, 2)))

	// tess evaluation
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_uniform_components_" + verifierSuffix).c_str(),		"Test MAX_TESS_EVALUATION_UNIFORM_COMPONENTS",		GL_MAX_TESS_EVALUATION_UNIFORM_COMPONENTS,		1024,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_texture_image_units_" + verifierSuffix).c_str(),		"Test MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS",		GL_MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS,		16,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_output_components_" + verifierSuffix).c_str(),		"Test MAX_TESS_EVALUATION_OUTPUT_COMPONENTS",		GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS,		64,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_input_components_" + verifierSuffix).c_str(),			"Test MAX_TESS_EVALUATION_INPUT_COMPONENTS",		GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS,		64,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_uniform_blocks_" + verifierSuffix).c_str(),			"Test MAX_TESS_EVALUATION_UNIFORM_BLOCKS",			GL_MAX_TESS_EVALUATION_UNIFORM_BLOCKS,			12,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_atomic_counter_buffers_" + verifierSuffix).c_str(),	"Test MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS",	GL_MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS,	0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_atomic_counters_" + verifierSuffix).c_str(),			"Test MAX_TESS_EVALUATION_ATOMIC_COUNTERS",			GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS,			0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_shader_storage_blocks_" + verifierSuffix).c_str(),	"Test MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS",	GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS,	0,		verifier,	glu::ApiType::es(3, 2)))

	// geometry
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_uniform_components_" + verifierSuffix).c_str(),				"Test MAX_GEOMETRY_UNIFORM_COMPONENTS",				GL_MAX_GEOMETRY_UNIFORM_COMPONENTS,				1024,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_uniform_blocks_" + verifierSuffix).c_str(),					"Test MAX_GEOMETRY_UNIFORM_BLOCKS",					GL_MAX_GEOMETRY_UNIFORM_BLOCKS,					12,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_input_components_" + verifierSuffix).c_str(),				"Test MAX_GEOMETRY_INPUT_COMPONENTS",				GL_MAX_GEOMETRY_INPUT_COMPONENTS,				64,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_output_components_" + verifierSuffix).c_str(),				"Test MAX_GEOMETRY_OUTPUT_COMPONENTS",				GL_MAX_GEOMETRY_OUTPUT_COMPONENTS,				64,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_output_vertices_" + verifierSuffix).c_str(),					"Test MAX_GEOMETRY_OUTPUT_VERTICES",				GL_MAX_GEOMETRY_OUTPUT_VERTICES,				256,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_total_output_components_" + verifierSuffix).c_str(),			"Test MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS",		GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS,		1024,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_texture_image_units_" + verifierSuffix).c_str(),				"Test MAX_GEOMETRY_TEXTURE_IMAGE_UNITS",			GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS,			16,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_shader_invocations_" + verifierSuffix).c_str(),				"Test MAX_GEOMETRY_SHADER_INVOCATIONS",				GL_MAX_GEOMETRY_SHADER_INVOCATIONS,				32,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_atomic_counter_buffers_" + verifierSuffix).c_str(),			"Test MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS",			GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,			0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_atomic_counters_" + verifierSuffix).c_str(),					"Test MAX_GEOMETRY_ATOMIC_COUNTERS",				GL_MAX_GEOMETRY_ATOMIC_COUNTERS,				0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_shader_storage_blocks_" + verifierSuffix).c_str(),			"Test MAX_GEOMETRY_SHADER_STORAGE_BLOCKS",			GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS,			0,		verifier,	glu::ApiType::es(3, 2)))

	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_control_image_uniforms_" + verifierSuffix).c_str(),				"Test MAX_TESS_CONTROL_IMAGE_UNIFORMS",				GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS,				0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_tess_evaluation_image_uniforms_" + verifierSuffix).c_str(),			"Test MAX_TESS_EVALUATION_IMAGE_UNIFORMS",			GL_MAX_TESS_EVALUATION_IMAGE_UNIFORMS,			0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_geometry_image_uniforms_" + verifierSuffix).c_str(),					"Test MAX_GEOMETRY_IMAGE_UNIFORMS",					GL_MAX_GEOMETRY_IMAGE_UNIFORMS,					0,		verifier,	glu::ApiType::es(3, 2)))

	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "debug_logged_messages_" + verifierSuffix).c_str(),						"Test DEBUG_LOGGED_MESSAGES",						GL_DEBUG_LOGGED_MESSAGES,						0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "debug_next_logged_message_length_" + verifierSuffix).c_str(),				"Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH",			GL_DEBUG_NEXT_LOGGED_MESSAGE_LENGTH,			0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "debug_group_stack_depth_" + verifierSuffix).c_str(),						"Test DEBUG_GROUP_STACK_DEPTH",						GL_DEBUG_GROUP_STACK_DEPTH,						0,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_debug_message_length_" + verifierSuffix).c_str(),						"Test MAX_DEBUG_MESSAGE_LENGTH",					GL_MAX_DEBUG_MESSAGE_LENGTH,					1,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_debug_logged_messages_" + verifierSuffix).c_str(),					"Test MAX_DEBUG_LOGGED_MESSAGES",					GL_MAX_DEBUG_LOGGED_MESSAGES,					1,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_debug_group_stack_depth_" + verifierSuffix).c_str(),					"Test MAX_DEBUG_GROUP_STACK_DEPTH",					GL_MAX_DEBUG_GROUP_STACK_DEPTH,					64,		verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "max_label_length_" + verifierSuffix).c_str(),								"Test MAX_LABEL_LENGTH",							GL_MAX_LABEL_LENGTH,							256,	verifier,	glu::ApiType::es(3, 2)))

	FOR_EACH_VERIFIER(new MinimumValueCase(m_context,	(std::string() + "texture_buffer_binding_" + verifierSuffix).c_str(),						"Test TEXTURE_BUFFER_BINDING",						GL_TEXTURE_BUFFER_BINDING,						0,		verifier,	glu::ApiType::es(3, 2)))

	FOR_EACH_VERIFIER(new CombinedUniformComponentsCase	(m_context,	(std::string() + "max_combined_tess_control_uniform_components_" + verifierSuffix).c_str(),		"Test MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS,	verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new CombinedUniformComponentsCase	(m_context,	(std::string() + "max_combined_tess_evaluation_uniform_components_" + verifierSuffix).c_str(),	"Test MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS, verifier,	glu::ApiType::es(3, 2)))
	FOR_EACH_VERIFIER(new CombinedUniformComponentsCase	(m_context,	(std::string() + "max_combined_geometry_uniform_components_" + verifierSuffix).c_str(),			"Test MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS",		GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS,		verifier,	glu::ApiType::es(3, 2)))

#undef FOR_EACH_VERIFIER
}